

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int gmatch_aux(lua_State *L)

{
  MatchState *ms;
  int iVar1;
  undefined8 *puVar2;
  char *e;
  char *s;
  
  puVar2 = (undefined8 *)lua_touserdata(L,-0xf462b);
  puVar2[6] = L;
  ms = (MatchState *)(puVar2 + 3);
  s = (char *)*puVar2;
  while( true ) {
    if ((char *)puVar2[4] < s) {
      return 0;
    }
    reprepstate(ms);
    e = match(ms,s,(char *)puVar2[1]);
    if ((e != (char *)0x0) && (e != (char *)puVar2[2])) break;
    s = s + 1;
  }
  puVar2[2] = e;
  *puVar2 = e;
  iVar1 = push_captures(ms,s,e);
  return iVar1;
}

Assistant:

static int gmatch_aux (lua_State *L) {
  GMatchState *gm = (GMatchState *)lua_touserdata(L, lua_upvalueindex(3));
  const char *src;
  gm->ms.L = L;
  for (src = gm->src; src <= gm->ms.src_end; src++) {
    const char *e;
    reprepstate(&gm->ms);
    if ((e = match(&gm->ms, src, gm->p)) != NULL && e != gm->lastmatch) {
      gm->src = gm->lastmatch = e;
      return push_captures(&gm->ms, src, e);
    }
  }
  return 0;  /* not found */
}